

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms443.cpp
# Opt level: O2

double wew_a(double x,double *en)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = log(x);
  if (x <= 6.46) {
    dVar3 = ((x * 1.3333333333333333 + 1.0) * x) /
            ((x * 0.8333333333333334 + 2.3333333333333335) * x + 1.0);
    dVar2 = log(dVar3);
    dVar2 = (dVar1 - dVar3) - dVar2;
  }
  else {
    dVar2 = log(dVar1);
    dVar2 = -dVar2;
    dVar3 = dVar1;
  }
  dVar5 = dVar3 + 1.0;
  dVar4 = (dVar2 * 0.6666666666666666 + dVar5) * (dVar5 + dVar5) - dVar2;
  dVar3 = ((dVar2 * dVar4) / ((dVar4 - dVar2) * dVar5) + 1.0) * dVar3;
  dVar2 = log(dVar3);
  dVar2 = (dVar1 - dVar3) - dVar2;
  dVar1 = dVar2 * 0.6666666666666666 + dVar3 + 1.0;
  dVar1 = (dVar2 * dVar1) / (dVar1 * (dVar3 + 1.0) + dVar2 * -0.5);
  *en = dVar1;
  return (dVar1 + 1.0) * dVar3;
}

Assistant:

double wew_a ( double x, double &en )

//****************************************************************************80
//
//  Purpose:
//
//    WEW_A estimates Lambert's W function.
//
//  Discussion:
//
//    For a given X, this routine estimates the solution W of Lambert's 
//    equation:
//
//      X = W * EXP ( W )
//
//    This routine has higher accuracy than WEW_B.
//
//  Modified:
//
//    11 June 2014
//
//  Reference:
//
//    Fred Fritsch, R Shafer, W Crowley,
//    Algorithm 443: Solution of the transcendental equation w e^w = x,
//    Communications of the ACM,
//    October 1973, Volume 16, Number 2, pages 123-124.
//
//  Parameters:
//
//    Input, double X, the argument of W(X)
//
//    Output, double &EN, the last relative correction to W(X).
//
//    Output, double WEW_A, the estimated value of W(X).
//
{
  const double c1 = 4.0 / 3.0;
  const double c2 = 7.0 / 3.0;
  const double c3 = 5.0 / 6.0;
  const double c4 = 2.0 / 3.0;
  double f;
  double temp;
  double temp2;
  double wn;
  double y;
  double zn;
//
//  Initial guess.
//
  f = log ( x );

  if ( x <= 6.46 )
  {
    wn = x * ( 1.0 + c1 * x ) / ( 1.0 + x * ( c2 + c3 * x ) );
    zn = f - wn - log ( wn );
  }
  else
  {
    wn = f;
    zn = - log ( wn );
  }
//
//  Iteration 1.
//
  temp = 1.0 + wn;
  y = 2.0 * temp * ( temp + c4 * zn ) - zn;
  wn = wn * ( 1.0 + zn * y / ( temp * ( y - zn ) ) );
//
//  Iteration 2.
//
  zn = f - wn - log ( wn );
  temp = 1.0 + wn;
  temp2 = temp + c4 * zn;
  en = zn * temp2 / ( temp * temp2 - 0.5 * zn );
  wn = wn * ( 1.0 + en );

  return wn;
}